

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsFloatingPointFoldingAllowed(Instruction *this)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  bool bVar2;
  uint32_t id;
  FeatureManager *pFVar3;
  bool is_nocontract;
  byte local_31;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pIVar1 = this->context_;
  pFVar3 = (pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar3 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
    pFVar3 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar2 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,CapabilityShader);
  if (bVar2) {
    pIVar1 = this->context_;
    pFVar3 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar3 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      pFVar3 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar2 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,CapabilityDenormPreserve);
    if (!bVar2) {
      pIVar1 = this->context_;
      pFVar3 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      if (pFVar3 == (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(pIVar1);
        pFVar3 = (pIVar1->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      }
      bVar2 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,CapabilityDenormFlushToZero)
      ;
      if (!bVar2) {
        pIVar1 = this->context_;
        pFVar3 = (pIVar1->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
        if (pFVar3 == (FeatureManager *)0x0) {
          IRContext::AnalyzeFeatures(pIVar1);
          pFVar3 = (pIVar1->feature_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                   .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
        }
        bVar2 = EnumSet<spv::Capability>::contains
                          (&pFVar3->capabilities_,CapabilitySignedZeroInfNanPreserve);
        if (!bVar2) {
          pIVar1 = this->context_;
          pFVar3 = (pIVar1->feature_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                   .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
          if (pFVar3 == (FeatureManager *)0x0) {
            IRContext::AnalyzeFeatures(pIVar1);
            pFVar3 = (pIVar1->feature_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                     .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
          }
          bVar2 = EnumSet<spv::Capability>::contains
                            (&pFVar3->capabilities_,CapabilityRoundingModeRTZ);
          if (!bVar2) {
            pIVar1 = this->context_;
            pFVar3 = (pIVar1->feature_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                     .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
            if (pFVar3 == (FeatureManager *)0x0) {
              IRContext::AnalyzeFeatures(pIVar1);
              pFVar3 = (pIVar1->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
            }
            bVar2 = EnumSet<spv::Capability>::contains
                              (&pFVar3->capabilities_,CapabilityRoundingModeRTE);
            if (!bVar2) {
              local_31 = 0;
              pIVar1 = this->context_;
              if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
                IRContext::BuildDecorationManager(pIVar1);
              }
              this_00 = (pIVar1->decoration_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                        _M_head_impl;
              id = 0;
              if (this->has_result_id_ == true) {
                id = GetSingleWordOperand(this,(uint)this->has_type_id_);
              }
              local_30._8_8_ = 0;
              local_30._M_unused._M_object = &local_31;
              local_18 = std::
                         _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:822:7)>
                         ::_M_invoke;
              local_20 = std::
                         _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:822:7)>
                         ::_M_manager;
              analysis::DecorationManager::WhileEachDecoration
                        (this_00,id,0x2a,
                         (function<bool_(const_spvtools::opt::Instruction_&)> *)&local_30);
              if (local_20 != (code *)0x0) {
                (*local_20)(&local_30,&local_30,__destroy_functor);
              }
              return (bool)(local_31 ^ 1);
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsFloatingPointFoldingAllowed() const {
  // TODO: Add the rules for kernels.  For now it will be pessimistic.
  // For now, do not support capabilities introduced by SPV_KHR_float_controls.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormFlushToZero) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::SignedZeroInfNanPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTZ) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTE)) {
    return false;
  }

  bool is_nocontract = false;
  context_->get_decoration_mgr()->WhileEachDecoration(
      result_id(), uint32_t(spv::Decoration::NoContraction),
      [&is_nocontract](const Instruction&) {
        is_nocontract = true;
        return false;
      });
  return !is_nocontract;
}